

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

void __thiscall CProfileIterator::Enter_Child(CProfileIterator *this,int index)

{
  CProfileNode *pCVar1;
  CProfileNode **ppCVar2;
  bool bVar3;
  
  ppCVar2 = &this->CurrentParent->Child;
  while( true ) {
    pCVar1 = *ppCVar2;
    this->CurrentChild = pCVar1;
    bVar3 = index == 0;
    index = index + -1;
    if ((pCVar1 == (CProfileNode *)0x0) || (bVar3)) break;
    ppCVar2 = &pCVar1->Sibling;
  }
  if (pCVar1 != (CProfileNode *)0x0) {
    this->CurrentParent = pCVar1;
    this->CurrentChild = pCVar1->Child;
  }
  return;
}

Assistant:

void	CProfileIterator::Enter_Child( int index )
{
	CurrentChild = CurrentParent->Get_Child();
	while ( (CurrentChild != NULL) && (index != 0) ) {
		index--;
		CurrentChild = CurrentChild->Get_Sibling();
	}

	if ( CurrentChild != NULL ) {
		CurrentParent = CurrentChild;
		CurrentChild = CurrentParent->Get_Child();
	}
}